

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_count_quantity.cpp
# Opt level: O2

void __thiscall
polyscope::SurfaceVertexIsolatedScalarQuantity::buildVertexInfoGUI
          (SurfaceVertexIsolatedScalarQuantity *this,size_t vInd)

{
  iterator iVar1;
  mapped_type_conflict1 *pmVar2;
  size_t local_20;
  
  local_20 = vInd;
  ImGui::TextUnformatted
            ((this->super_SurfaceCountQuantity).super_SurfaceMeshQuantity.
             super_Quantity<polyscope::SurfaceMesh>.name._M_dataplus._M_p,(char *)0x0);
  ImGui::NextColumn();
  iVar1 = std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_double>,_std::_Select1st<std::pair<const_unsigned_long,_double>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
          ::find(&(this->values)._M_t,&local_20);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->values)._M_t._M_impl.super__Rb_tree_header) {
    ImGui::TextUnformatted("-",(char *)0x0);
  }
  else {
    pmVar2 = std::
             map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>
             ::operator[](&this->values,&local_20);
    ImGui::Text("%g",*pmVar2);
  }
  ImGui::NextColumn();
  return;
}

Assistant:

void SurfaceVertexIsolatedScalarQuantity::buildVertexInfoGUI(size_t vInd) {
  ImGui::TextUnformatted(name.c_str());
  ImGui::NextColumn();
  if (values.find(vInd) == values.end()) {
    ImGui::TextUnformatted("-");
  } else {
    ImGui::Text("%g", values[vInd]);
  }
  ImGui::NextColumn();
}